

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibReader.cpp
# Opt level: O0

void __thiscall ZlibReader::ZlibReader(ZlibReader *this)

{
  ZlibReader *this_local;
  
  this->_vptr_ZlibReader = (_func_int **)&PTR__ZlibReader_00112d58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->zbuf);
  this->zbuf_crc = 0;
  this->initialized = false;
  reset_zlib(this);
  this->initialized = true;
  return;
}

Assistant:

ZlibReader::ZlibReader() :
	initialized(false),
	zbuf_crc(0)
{
	reset_zlib();
	initialized = true;
}